

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int *piVar2;
  thread responder;
  thread talker;
  thread local_28;
  timespec local_20;
  function_type *local_10;
  
  local_20.tv_sec = (__time_t)responsive_thread;
  std::thread::thread<void(*)(),,void>(&local_28,(function_type **)&local_20);
  local_20.tv_sec = 0;
  local_20.tv_nsec = 500000000;
  do {
    iVar1 = nanosleep(&local_20,&local_20);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_10 = talkative_thread;
  std::thread::thread<void(*)(),,void>((thread *)&local_20,&local_10);
  std::thread::join();
  std::thread::join();
  if ((local_20.tv_sec == 0) && (local_28._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int
main()
{
  std::thread responder(&responsive_thread);
  std::this_thread::sleep_for(500ms);
  std::thread talker(&talkative_thread);
  responder.join();
  talker.join();
}